

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-event.c
# Opt level: O1

void event_signal_tunnel(game_event_type type,wchar_t nstep,wchar_t npierce,wchar_t ndug,
                        wchar_t dstart,wchar_t dend,_Bool early)

{
  event_handler_entry *peVar1;
  game_event_data local_48;
  
  local_48.point.x = nstep;
  local_48.point.y = npierce;
  local_48.message.type = ndug;
  local_48.bolt.ox = dstart;
  local_48.birthstage.n_choices = dend;
  local_48.tunnel.early = early;
  for (peVar1 = event_handlers[type]; peVar1 != (event_handler_entry *)0x0; peVar1 = peVar1->next) {
    (*peVar1->fn)(type,&local_48,peVar1->user);
  }
  return;
}

Assistant:

void event_signal_tunnel(game_event_type type, int nstep, int npierce, int ndug,
		int dstart, int dend, bool early)
{
	game_event_data data;

	data.tunnel.nstep = nstep;
	data.tunnel.npierce = npierce;
	data.tunnel.ndug = ndug;
	data.tunnel.dstart = dstart;
	data.tunnel.dend = dend;
	data.tunnel.early = early;
	game_event_dispatch(type, &data);
}